

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

void __thiscall json::string::string(string *this,string *other)

{
  string *other_local;
  string *this_local;
  
  json::value::value(&this->super_value);
  (this->super_value)._vptr_value = (_func_int **)&PTR__string_00211b90;
  std::__cxx11::string::string((string *)&this->_data);
  std::__cxx11::string::operator=((string *)&this->_data,(string *)other);
  return;
}

Assistant:

json::string::string (const std::string& other)
{
  _data = other;
}